

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_enforce_retry(int use_cookie)

{
  int iVar1;
  int iVar2;
  ptls_t *tls;
  size_t sStack_108;
  int ret;
  size_t consumed;
  ptls_buffer_t decbuf;
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  ptls_handshake_properties_t server_hs_prop;
  ptls_t *server;
  ptls_t *client;
  int use_cookie_local;
  
  memset(&cbuf.is_allocated,0,0x80);
  ptls_iovec_init("1.2.3.4:1234",0xc);
  ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)&decbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)&consumed,"",0);
  tls = ptls_new(ctx,0);
  iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x3fc);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x3fd);
  server_hs_prop.collected_extensions =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
       ptls_new(ctx,1);
  sStack_108 = cbuf.capacity;
  do {
    iVar1 = ptls_handshake((ptls_t *)server_hs_prop.collected_extensions,
                           (ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                           &stack0xfffffffffffffef8,
                           (ptls_handshake_properties_t *)&cbuf.is_allocated);
    iVar2 = ptls_handshake_in_private_key((ptls_t *)server_hs_prop.collected_extensions);
  } while (iVar2 != 0);
  cbuf.capacity = 0;
  if (use_cookie == 0) {
    _ok((uint)(iVar1 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x40c);
  }
  else {
    _ok((uint)(iVar1 == 0x206),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x408);
    ptls_free((ptls_t *)server_hs_prop.collected_extensions);
    server_hs_prop.collected_extensions =
         (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
         ptls_new(ctx,1);
  }
  sStack_108 = sbuf.capacity;
  iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                         &stack0xfffffffffffffef8,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x411);
  _ok((uint)(sbuf.capacity == sStack_108),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x412);
  sbuf.capacity = 0;
  sStack_108 = cbuf.capacity;
  do {
    iVar1 = ptls_handshake((ptls_t *)server_hs_prop.collected_extensions,
                           (ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                           &stack0xfffffffffffffef8,
                           (ptls_handshake_properties_t *)&cbuf.is_allocated);
    iVar2 = ptls_handshake_in_private_key((ptls_t *)server_hs_prop.collected_extensions);
  } while (iVar2 != 0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x419);
  _ok((uint)(cbuf.capacity == sStack_108),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x41a);
  cbuf.capacity = 0;
  sStack_108 = sbuf.capacity;
  iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                         &stack0xfffffffffffffef8,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x41f);
  _ok((uint)(sbuf.capacity == sStack_108),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x420);
  sbuf.capacity = 0;
  iVar1 = ptls_send(tls,(ptls_buffer_t *)&sbuf.is_allocated,"hello world",0xb);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x424);
  sStack_108 = cbuf.capacity;
  do {
    iVar1 = ptls_receive((ptls_t *)server_hs_prop.collected_extensions,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&stack0xfffffffffffffef8);
    iVar2 = ptls_handshake_in_private_key((ptls_t *)server_hs_prop.collected_extensions);
  } while (iVar2 != 0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42a);
  _ok((uint)(cbuf.capacity == sStack_108),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42b);
  cbuf.capacity = 0;
  _ok((uint)(decbuf.capacity == 0xb),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42e);
  iVar1 = memcmp((void *)consumed,"hello world",0xb);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42f);
  decbuf.capacity = 0;
  ptls_free(tls);
  ptls_free((ptls_t *)server_hs_prop.collected_extensions);
  ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)&decbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)&consumed);
  return;
}

Assistant:

static void test_enforce_retry(int use_cookie)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed;
    int ret;

    server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
    server_hs_prop.server.cookie.additional_data = ptls_iovec_init("1.2.3.4:1234", 12);
    server_hs_prop.server.enforce_retry = 1;
    server_hs_prop.server.retry_uses_cookie = use_cookie;

    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);
    ptls_buffer_init(&decbuf, "", 0);

    client = ptls_new(ctx, 0);

    ret = ptls_handshake(client, &cbuf, NULL, NULL, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);

    server = ptls_new(ctx, 1);

    consumed = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
    while (ptls_handshake_in_private_key(server));
    cbuf.off = 0;

    if (use_cookie) {
        ok(ret == PTLS_ERROR_STATELESS_RETRY);
        ptls_free(server);
        server = ptls_new(ctx, 1);
    } else {
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off == consumed);
    sbuf.off = 0;

    consumed = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(cbuf.off == consumed);
    cbuf.off = 0;

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(sbuf.off == consumed);
    sbuf.off = 0;

    ret = ptls_send(client, &cbuf, "hello world", 11);
    ok(ret == 0);

    consumed = cbuf.off;
    do
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(cbuf.off == consumed);
    cbuf.off = 0;

    ok(decbuf.off == 11);
    ok(memcmp(decbuf.base, "hello world", 11) == 0);
    decbuf.off = 0;

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
}